

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseBandwidth.cpp
# Opt level: O0

void __thiscall
tonk::SenderBandwidthControl::RecalculateAvailableBytes
          (SenderBandwidthControl *this,uint64_t nowUsec)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  long in_RSI;
  long in_RDI;
  int tokenLimit;
  uint addedTokens;
  uint bps;
  int availableTokens;
  uint64_t tickIntervalUsec;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  ulong local_18;
  
  local_18 = in_RSI - *(long *)(in_RDI + 0x40);
  *(long *)(in_RDI + 0x40) = in_RSI;
  std::__atomic_base::operator_cast_to_int
            ((__atomic_base<int> *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (10000 < local_18) {
    local_18 = 10000;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(uint *)(in_RDI + 0x48) * local_18;
  iVar2 = SUB164(auVar1 / ZEXT816(1000000),0);
  iVar3 = iVar2 + 13000;
  std::__atomic_base<int>::operator=
            ((__atomic_base<int> *)CONCAT44(iVar2,iVar3),
             (__int_type_conflict1)((ulong)in_RDI >> 0x20));
  if (iVar3 * 4 < *(int *)(in_RDI + 0x58)) {
    *(int *)(in_RDI + 0x58) = iVar3 << 2;
  }
  return;
}

Assistant:

void SenderBandwidthControl::RecalculateAvailableBytes(uint64_t nowUsec)
{
    TONK_DEBUG_ASSERT(Shape.AppBPS < 1 * 1000 * 1000 * 1000); // Will not fit in integer

    // Calculate the time since the last tick
    uint64_t tickIntervalUsec = nowUsec - LastIntervalStartUsec;
    LastIntervalStartUsec = nowUsec;

    // Calculate deficit from last tick
    int availableTokens = AvailableTokens;

    unsigned bps = Shape.AppBPS;

    // If we skipped a lot of time, take away all the tokens.
    // This also handles the first tick where the interval is undefined
    static const uint64_t kMaxTickIntervalUsec = 500 * 1000; // 500 ms
    if (tickIntervalUsec >= kMaxTickIntervalUsec) {
        availableTokens = 0;
    }

    // Limit the maximum number of skipped ticks to reward in one tick
    if (tickIntervalUsec > protocol::kSendTimerTickIntervalUsec * 2) {
        tickIntervalUsec = protocol::kSendTimerTickIntervalUsec * 2;
    }

    // Calculate how many bucket tokens were generated since the last tick
    const unsigned addedTokens = (unsigned)(((uint64_t)bps * tickIntervalUsec) / 1000000);

    availableTokens += addedTokens;

    // Limit available tokens to the bucket size plus some burst amount.
    // The burst amount matches the slow start burst size of CWND = 10 in TCP
    const int tokenLimit = static_cast<int>(addedTokens) + protocol::kBandwidthBurstTokenLimit;

    if (availableTokens > tokenLimit)
    {
        // Do not allow bursts that are too large.
        // If the application decides to send no data,
        // then avoid over-rewarding.  This prevents huge bursts of
        // data from being sent
        availableTokens = tokenLimit;
    }
    else if (availableTokens < -tokenLimit)
    {
        // Do not allow deficits that are too negative.
        // If the application decides to disregard the bandwidth limit,
        // then avoid over-penalizing.  This will allow sending data
        // within about two ticks after a burst at the longest
        availableTokens = -tokenLimit;
    }

    // Commit the available tokens
    AvailableTokens = availableTokens;

    // Limit the number of probe send tokens so they do not accumulate to a huge
    // number while the application is sending data, and later would lead to a
    // sustained probe while the application is not sending data.  This choice
    // is designed to allow for four ticks of probing beyond the application
    // data rate before reducing the rate
    if (ProbeSendTokens > tokenLimit * 4) {
        ProbeSendTokens = tokenLimit * 4;
    }
}